

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O3

size_t ZSTD_compress_insertDictionary
                 (ZSTD_compressedBlockState_t *bs,ZSTD_matchState_t *ms,ZSTD_CCtx_params *params,
                 void *dict,size_t dictSize,ZSTD_dictContentType_e dictContentType,
                 ZSTD_dictTableLoadMethod_e dtlm,void *workspace)

{
  U32 *src;
  uint uVar1;
  size_t sVar2;
  size_t sVar3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  U32 *pUVar7;
  ulong srcSize;
  void *pvVar8;
  U32 *pUVar9;
  uint matchlengthMaxValue;
  uint maxSymbolValue;
  short offcodeNCount [32];
  uint local_11c;
  uint local_118;
  uint local_114;
  size_t local_110;
  HUF_repeat *local_108;
  U32 *local_100;
  ZSTD_matchState_t *local_f8;
  ZSTD_CCtx_params *local_f0;
  U32 local_e8 [28];
  short local_78 [36];
  
  if (8 < dictSize && dict != (void *)0x0) {
    bs->rep[0] = 1;
    bs->rep[1] = 4;
    bs->rep[2] = 8;
    (bs->entropy).hufCTable_repeatMode = HUF_repeat_none;
    (bs->entropy).offcode_repeatMode = FSE_repeat_none;
    (bs->entropy).matchlength_repeatMode = FSE_repeat_none;
    (bs->entropy).litlength_repeatMode = FSE_repeat_none;
    if (dictContentType != ZSTD_dct_rawContent) {
      if (*dict == -0x13cf5bc9) {
LAB_00155242:
        local_118 = 0x1f;
        if ((params->fParams).noDictIDFlag == 0) {
          local_110 = (size_t)*(uint *)((long)dict + 4);
        }
        else {
          local_110 = 0;
        }
        local_e8[0] = 0xff;
        local_f8 = ms;
        local_f0 = params;
        sVar2 = HUF_readCTable((HUF_CElt *)bs,local_e8,(void *)((long)dict + 8),dictSize - 8);
        uVar1 = HUF_isError(sVar2);
        if (local_e8[0] < 0xff || uVar1 != 0) {
          return 0xffffffffffffffe2;
        }
        pUVar7 = (U32 *)(dictSize + (long)dict);
        pvVar8 = (void *)((long)dict + sVar2 + 8);
        sVar2 = FSE_readNCount(local_78,&local_118,local_e8,pvVar8,(long)pUVar7 - (long)pvVar8);
        uVar1 = FSE_isError(sVar2);
        if (uVar1 != 0) {
          return 0xffffffffffffffe2;
        }
        if (8 < local_e8[0]) {
          return 0xffffffffffffffe2;
        }
        sVar3 = FSE_buildCTable_wksp
                          ((bs->entropy).offcodeCTable,local_78,0x1f,local_e8[0],workspace,0x1800);
        pvVar8 = (void *)(sVar2 + (long)pvVar8);
        if (0xffffffffffffff88 < sVar3) {
          return 0xffffffffffffffe2;
        }
        local_11c = 0x34;
        sVar2 = FSE_readNCount((short *)local_e8,&local_11c,&local_114,pvVar8,
                               (long)pUVar7 - (long)pvVar8);
        uVar1 = FSE_isError(sVar2);
        if (9 < local_114 || uVar1 != 0) {
          return 0xffffffffffffffe2;
        }
        if (local_11c < 0x34) {
          return 0xffffffffffffffe2;
        }
        local_100 = bs->rep;
        lVar4 = 0;
        do {
          if (local_78[lVar4 + -0x38] == 0) {
            return 0xffffffffffffffe2;
          }
          lVar4 = lVar4 + 1;
        } while (lVar4 != 0x35);
        sVar3 = FSE_buildCTable_wksp
                          ((bs->entropy).matchlengthCTable,(short *)local_e8,local_11c,local_114,
                           workspace,0x1800);
        pvVar8 = (void *)(sVar2 + (long)pvVar8);
        if (sVar3 < 0xffffffffffffff89) {
          local_11c = 0x23;
          local_108 = &(bs->entropy).hufCTable_repeatMode;
          sVar2 = FSE_readNCount((short *)local_e8,&local_11c,&local_114,pvVar8,
                                 (long)pUVar7 - (long)pvVar8);
          uVar1 = FSE_isError(sVar2);
          if (9 < local_114 || uVar1 != 0) {
            return 0xffffffffffffffe2;
          }
          if (local_11c < 0x23) {
            return 0xffffffffffffffe2;
          }
          lVar4 = 0;
          do {
            if (local_78[lVar4 + -0x38] == 0) {
              return 0xffffffffffffffe2;
            }
            lVar4 = lVar4 + 1;
          } while (lVar4 != 0x24);
          sVar3 = FSE_buildCTable_wksp
                            ((bs->entropy).litlengthCTable,(short *)local_e8,local_11c,local_114,
                             workspace,0x1800);
          if (sVar3 < 0xffffffffffffff89) {
            pUVar9 = (U32 *)((long)pvVar8 + sVar2);
            src = pUVar9 + 3;
            if (pUVar7 < src) {
              return 0xffffffffffffffe2;
            }
            bs->rep[0] = *pUVar9;
            bs->rep[1] = pUVar9[1];
            bs->rep[2] = pUVar9[2];
            srcSize = (long)pUVar7 - (long)src;
            uVar5 = (int)srcSize + 0x20000;
            uVar1 = 0x1f;
            if (uVar5 != 0) {
              for (; uVar5 >> uVar1 == 0; uVar1 = uVar1 - 1) {
              }
            }
            uVar5 = 0x1f;
            if (srcSize >> 0x11 < 0x7fff) {
              uVar5 = uVar1;
            }
            if (uVar5 <= local_118) {
              uVar6 = 0;
              do {
                if (local_78[uVar6] == 0) {
                  return 0xffffffffffffffe2;
                }
                uVar6 = uVar6 + 1;
              } while (uVar5 + 1 != uVar6);
              lVar4 = 0;
              while( true ) {
                if ((ulong)local_100[lVar4] == 0) {
                  return 0xffffffffffffffe2;
                }
                if (srcSize < local_100[lVar4]) break;
                lVar4 = lVar4 + 1;
                if (lVar4 == 3) {
                  local_108[0] = HUF_repeat_valid;
                  local_108[1] = HUF_repeat_valid;
                  *(undefined8 *)(local_108 + 2) = 0x200000002;
                  ZSTD_loadDictionaryContent(local_f8,local_f0,src,srcSize,dtlm);
                  return local_110;
                }
              }
              return 0xffffffffffffffe2;
            }
            return 0xffffffffffffffe2;
          }
          return 0xffffffffffffffe2;
        }
        return 0xffffffffffffffe2;
      }
      if (dictContentType == ZSTD_dct_fullDict) {
        return 0xffffffffffffffe0;
      }
      if (dictContentType != ZSTD_dct_auto) goto LAB_00155242;
    }
    ZSTD_loadDictionaryContent(ms,params,dict,dictSize,dtlm);
  }
  return 0;
}

Assistant:

static size_t
ZSTD_compress_insertDictionary(ZSTD_compressedBlockState_t* bs,
                               ZSTD_matchState_t* ms,
                         const ZSTD_CCtx_params* params,
                         const void* dict, size_t dictSize,
                               ZSTD_dictContentType_e dictContentType,
                               ZSTD_dictTableLoadMethod_e dtlm,
                               void* workspace)
{
    DEBUGLOG(4, "ZSTD_compress_insertDictionary (dictSize=%u)", (U32)dictSize);
    if ((dict==NULL) || (dictSize<=8)) return 0;

    ZSTD_reset_compressedBlockState(bs);

    /* dict restricted modes */
    if (dictContentType == ZSTD_dct_rawContent)
        return ZSTD_loadDictionaryContent(ms, params, dict, dictSize, dtlm);

    if (MEM_readLE32(dict) != ZSTD_MAGIC_DICTIONARY) {
        if (dictContentType == ZSTD_dct_auto) {
            DEBUGLOG(4, "raw content dictionary detected");
            return ZSTD_loadDictionaryContent(ms, params, dict, dictSize, dtlm);
        }
        if (dictContentType == ZSTD_dct_fullDict)
            return ERROR(dictionary_wrong);
        assert(0);   /* impossible */
    }

    /* dict as full zstd dictionary */
    return ZSTD_loadZstdDictionary(bs, ms, params, dict, dictSize, dtlm, workspace);
}